

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execution-results.h
# Opt level: O0

bool __thiscall wasm::ExecutionResults::areEqual(ExecutionResults *this,Literal *a,Literal *b)

{
  Literal LVar1;
  Literal LVar2;
  bool bVar3;
  ulong uVar4;
  Type TVar5;
  ostream *poVar6;
  undefined8 in_stack_ffffffffffffff48;
  undefined8 in_stack_ffffffffffffff50;
  byte local_71;
  Literal local_70;
  Literal local_48;
  HeapType local_30;
  Literal *local_28;
  Literal *b_local;
  Literal *a_local;
  ExecutionResults *this_local;
  
  local_28 = b;
  b_local = a;
  a_local = (Literal *)this;
  bVar3 = Type::isRef(&a->type);
  local_71 = 0;
  if (bVar3) {
    bVar3 = Type::isString(&a->type);
    local_71 = 0;
    if (!bVar3) {
      local_30 = Type::getHeapType(&a->type);
      bVar3 = HeapType::isMaybeShared(&local_30,i31);
      local_71 = bVar3 ^ 0xff;
    }
  }
  if ((local_71 & 1) == 0) {
    uVar4 = ::wasm::Literal::operator!=(a,b);
    if ((uVar4 & 1) == 0) {
      this_local._7_1_ = true;
    }
    else {
      TVar5.id = (uintptr_t)std::operator<<((ostream *)&std::cout,"values not identical! ");
      ::wasm::Literal::Literal(&local_48,a);
      LVar1.field_0.func.super_IString.str._M_str = (char *)in_stack_ffffffffffffff50;
      LVar1.field_0.i64 = in_stack_ffffffffffffff48;
      LVar1.type.id = TVar5.id;
      poVar6 = (ostream *)::wasm::operator<<((ostream *)TVar5.id,LVar1);
      poVar6 = std::operator<<(poVar6," != ");
      ::wasm::Literal::Literal(&local_70,b);
      LVar2.field_0.func.super_IString.str._M_str = (char *)poVar6;
      LVar2.field_0.i64 = in_stack_ffffffffffffff48;
      LVar2.type.id = TVar5.id;
      poVar6 = (ostream *)::wasm::operator<<(poVar6,LVar2);
      std::operator<<(poVar6,'\n');
      ::wasm::Literal::~Literal(&local_70);
      ::wasm::Literal::~Literal(&local_48);
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool areEqual(Literal a, Literal b) {
    // Don't compare references. There are several issues here that we can't
    // fully handle, see https://github.com/WebAssembly/binaryen/issues/3378,
    // but the core issue is that since we optimize assuming a closed world, the
    // types and structure of GC data can arbitrarily change after
    // optimizations, even in ways that are externally visible from outside
    // the module.
    //
    // We can, however, compare strings as they refer to simple data that has a
    // consistent representation (the same reasons as why we can print them in
    // printValue(), above).
    //
    // TODO: Once we support optimizing under some form of open-world
    // assumption, we should be able to check that the types and/or structure of
    // GC data passed out of the module does not change.
    if (a.type.isRef() && !a.type.isString() &&
        !a.type.getHeapType().isMaybeShared(HeapType::i31)) {
      return true;
    }
    if (a != b) {
      std::cout << "values not identical! " << a << " != " << b << '\n';
      return false;
    }
    return true;
  }